

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderSwitchTests.cpp
# Opt level: O1

void deqp::gles3::Functional::makeSwitchCases
               (TestCaseGroup *group,char *name,char *desc,LineStream *switchBody)

{
  Context *pCVar1;
  long *plVar2;
  TestNode *pTVar3;
  long *plVar4;
  long lVar5;
  allocator<char> local_d9;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  TestCaseGroup *local_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70 [2];
  long local_60 [2];
  char **local_50;
  char *local_48;
  LineStream *local_40;
  char *local_38;
  
  local_50 = makeSwitchCases::switchTypeNames;
  lVar5 = 0;
  local_98 = group;
  local_48 = desc;
  local_40 = switchBody;
  local_38 = name;
  do {
    pCVar1 = local_98->m_context;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_70,local_38,&local_d9);
    plVar2 = (long *)std::__cxx11::string::append((char *)local_70);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_80 = *plVar4;
      lStack_78 = plVar2[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar4;
      local_90 = (long *)*plVar2;
    }
    local_88 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_d8 = &local_c8;
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_c8 = *plVar4;
      lStack_c0 = plVar2[3];
    }
    else {
      local_c8 = *plVar4;
      local_d8 = (long *)*plVar2;
    }
    local_d0 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_d8);
    local_b8 = &local_a8;
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_a8 = *plVar4;
      lStack_a0 = plVar2[3];
    }
    else {
      local_a8 = *plVar4;
      local_b8 = (long *)*plVar2;
    }
    local_b0 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    pTVar3 = &makeSwitchCase(pCVar1,(char *)local_b8,local_48,(SwitchType)lVar5,true,local_40)->
              super_TestNode;
    tcu::TestNode::addChild((TestNode *)local_98,pTVar3);
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    pCVar1 = local_98->m_context;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_70,local_38,&local_d9);
    plVar2 = (long *)std::__cxx11::string::append((char *)local_70);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_80 = *plVar4;
      lStack_78 = plVar2[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar4;
      local_90 = (long *)*plVar2;
    }
    local_88 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_d8 = &local_c8;
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_c8 = *plVar4;
      lStack_c0 = plVar2[3];
    }
    else {
      local_c8 = *plVar4;
      local_d8 = (long *)*plVar2;
    }
    local_d0 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_d8);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_a8 = *plVar4;
      lStack_a0 = plVar2[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *plVar4;
      local_b8 = (long *)*plVar2;
    }
    local_b0 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    pTVar3 = &makeSwitchCase(pCVar1,(char *)local_b8,local_48,(SwitchType)lVar5,false,local_40)->
              super_TestNode;
    tcu::TestNode::addChild((TestNode *)local_98,pTVar3);
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    lVar5 = lVar5 + 1;
    local_50 = local_50 + 1;
  } while (lVar5 != 3);
  return;
}

Assistant:

static void makeSwitchCases (TestCaseGroup* group, const char* name, const char* desc, const LineStream& switchBody)
{
	static const char* switchTypeNames[] = { "static", "uniform", "dynamic" };
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(switchTypeNames) == SWITCHTYPE_LAST);

	for (int type = 0; type < SWITCHTYPE_LAST; type++)
	{
		group->addChild(makeSwitchCase(group->getContext(), (string(name) + "_" + switchTypeNames[type] + "_vertex").c_str(),	desc, (SwitchType)type, true,	switchBody));
		group->addChild(makeSwitchCase(group->getContext(), (string(name) + "_" + switchTypeNames[type] + "_fragment").c_str(),	desc, (SwitchType)type, false,	switchBody));
	}
}